

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O1

Future<CreateResponse> * __thiscall Future<CreateResponse>::get(Future<CreateResponse> *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_RSI;
  CreateResponse local_c0 [8];
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if ((*(char *)(in_RSI + 0xb8) == '\0') && (*(undefined8 **)(in_RSI + 8) != (undefined8 *)0x0)) {
    (**(code **)**(undefined8 **)(in_RSI + 8))(local_c0);
    *(undefined4 *)(in_RSI + 0x20) = local_b8;
    *(undefined8 *)(in_RSI + 0x50) = local_88;
    *(undefined8 *)(in_RSI + 0x58) = uStack_80;
    *(undefined8 *)(in_RSI + 0x40) = local_98;
    *(undefined8 *)(in_RSI + 0x48) = uStack_90;
    *(undefined8 *)(in_RSI + 0x30) = local_a8;
    *(undefined8 *)(in_RSI + 0x38) = uStack_a0;
    *(undefined8 *)(in_RSI + 0x68) = local_70;
    *(undefined8 *)(in_RSI + 0x70) = uStack_68;
    *(undefined8 *)(in_RSI + 0x78) = local_60;
    *(undefined8 *)(in_RSI + 0x80) = uStack_58;
    *(undefined8 *)(in_RSI + 0x88) = local_50;
    *(undefined8 *)(in_RSI + 0x90) = uStack_48;
    *(undefined8 *)(in_RSI + 0x98) = local_40;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xa0),&local_38);
    *(undefined8 *)(in_RSI + 0xa8) = local_30;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xb0),&local_28);
    CreateResponse::~CreateResponse(local_c0);
    *(undefined1 *)(in_RSI + 0xb8) = 1;
  }
  (this->super_AsyncTask<CreateResponse>)._vptr_AsyncTask = (_func_int **)FileInfo::FileInfo;
  *(undefined4 *)
   &(this->task_).super___shared_ptr<AsyncTask<CreateResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(undefined4 *)(in_RSI + 0x20);
  (this->super_AsyncTask<CreateResponse>)._vptr_AsyncTask = (_func_int **)&__libc_single_threaded;
  (this->task_).super___shared_ptr<AsyncTask<CreateResponse>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CrailOutputstream::Write;
  uVar2 = *(undefined8 *)(in_RSI + 0x38);
  uVar3 = *(undefined8 *)(in_RSI + 0x40);
  uVar4 = *(undefined8 *)(in_RSI + 0x48);
  uVar5 = *(undefined8 *)(in_RSI + 0x50);
  uVar6 = *(undefined8 *)(in_RSI + 0x58);
  *(undefined8 *)&this->result_ = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)&this->field_0x20 = uVar2;
  *(undefined8 *)&this->field_0x28 = uVar3;
  *(undefined8 *)&this->field_0x30 = uVar4;
  *(undefined8 *)&this->field_0x38 = uVar5;
  *(undefined8 *)&this->field_0x40 = uVar6;
  *(code **)&this->field_0x48 = CrailOutputstream::Write;
  uVar2 = *(undefined8 *)(in_RSI + 0x70);
  uVar3 = *(undefined8 *)(in_RSI + 0x78);
  uVar4 = *(undefined8 *)(in_RSI + 0x80);
  uVar5 = *(undefined8 *)(in_RSI + 0x88);
  uVar6 = *(undefined8 *)(in_RSI + 0x90);
  *(undefined8 *)&this->field_0x50 = *(undefined8 *)(in_RSI + 0x68);
  *(undefined8 *)&this->field_0x58 = uVar2;
  *(undefined8 *)&this->field_0x60 = uVar3;
  *(undefined8 *)&this->field_0x68 = uVar4;
  *(undefined8 *)&this->field_0x70 = uVar5;
  *(undefined8 *)&this->field_0x78 = uVar6;
  *(undefined8 *)&this->field_0x80 = *(undefined8 *)(in_RSI + 0x98);
  lVar1 = *(long *)(in_RSI + 0xa0);
  *(long *)&this->field_0x88 = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)(in_RSI + 0xa8);
  lVar1 = *(long *)(in_RSI + 0xb0);
  *(long *)&this->field_0x98 = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  return this;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }